

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeElement(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int i,int j,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *val,bool scale)

{
  uint uVar1;
  fpclass_type fVar2;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  int32_t iVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Item *this_02;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  char *pcVar10;
  uint *puVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  ulong uVar14;
  char *pcVar15;
  undefined4 *puVar16;
  uint *puVar17;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar18;
  undefined7 in_register_00000081;
  Item *this_03;
  bool bVar19;
  byte bVar20;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  uint local_24c;
  uint local_248;
  undefined4 local_244;
  Item *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  uint local_1c8 [3];
  undefined3 uStack_1bb;
  int iStack_1b8;
  bool bStack_1b4;
  undefined8 local_1b0;
  cpp_dec_float<200U,_int,_void> local_1a0;
  uint local_120 [28];
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar20 = 0;
  if ((j | i) < 0) {
    return;
  }
  local_244 = (undefined4)CONCAT71(in_register_00000081,scale);
  this_03 = (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[i].idx;
  local_240 = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[j].idx;
  puVar11 = (uint *)val;
  puVar17 = local_120;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar17 = *puVar11;
    puVar11 = puVar11 + 1;
    puVar17 = puVar17 + 1;
  }
  iVar6 = (val->m_backend).exp;
  bVar19 = (val->m_backend).neg;
  local_238._0_4_ = (val->m_backend).fpclass;
  local_238._4_4_ = (val->m_backend).prec_elem;
  uStack_230 = 0;
  this_00 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_24c = i;
  local_248 = j;
  a = Tolerances::epsilon(this_00);
  puVar11 = local_120;
  pcVar13 = &local_1a0;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pcVar13->data)._M_elems[0] = *puVar11;
    puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar20 * -2 + 1) * 4);
  }
  local_1a0.exp = iVar6;
  local_1a0.neg = bVar19;
  local_1a0.fpclass = (fpclass_type)local_238;
  local_1a0.prec_elem = local_238._4_4_;
  if ((bVar19 != false) &&
     (local_1a0.data._M_elems[0] != 0 || (fpclass_type)local_238 != cpp_dec_float_finite)) {
    local_1a0.neg = (bool)(bVar19 ^ 1);
  }
  bVar19 = false;
  if (((fpclass_type)local_238 != cpp_dec_float_NaN) && (!NAN(a))) {
    local_1b0._0_4_ = cpp_dec_float_finite;
    local_1b0._4_4_ = 0x1c;
    local_228 = (undefined1  [16])0x0;
    local_218 = (undefined1  [16])0x0;
    local_208 = (undefined1  [16])0x0;
    local_1f8 = (undefined1  [16])0x0;
    local_1e8 = (undefined1  [16])0x0;
    local_1d8 = (undefined1  [16])0x0;
    local_1c8[0] = 0;
    local_1c8[1] = 0;
    stack0xfffffffffffffe40 = 0;
    uStack_1bb = 0;
    iStack_1b8 = 0;
    bStack_1b4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_228,a);
    iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_1a0,(cpp_dec_float<200U,_int,_void> *)local_228);
    bVar19 = 0 < iVar6;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  this_02 = local_240;
  if (!bVar19) {
    pNVar4 = (this_03->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if ((pNVar4 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) ||
       (uVar14 = (ulong)(this_03->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused, (long)uVar14 < 1)) {
LAB_004fdcc9:
      iVar6 = -1;
    }
    else {
      if (pNVar4->idx == local_248) {
        bVar19 = true;
        uVar7 = 0;
      }
      else {
        uVar7 = 0;
        piVar8 = &pNVar4[1].idx;
        do {
          if (uVar14 - 1 == uVar7) goto LAB_004fdcc9;
          uVar7 = uVar7 + 1;
          uVar1 = *piVar8;
          piVar8 = piVar8 + 0x21;
        } while (uVar1 != local_248);
        bVar19 = uVar7 < uVar14;
      }
      iVar6 = (int)uVar7;
      if (!bVar19) goto LAB_004fdcc9;
    }
    if (iVar6 < 0) {
      return;
    }
    pNVar18 = (local_240->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    if ((pNVar18 ==
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0) ||
       (uVar14 = (ulong)(local_240->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused, (long)uVar14 < 1)) {
LAB_004fdde5:
      iVar6 = -1;
    }
    else {
      if (pNVar18->idx == local_24c) {
        bVar19 = true;
        uVar7 = 0;
      }
      else {
        uVar7 = 0;
        piVar8 = &pNVar18[1].idx;
        do {
          if (uVar14 - 1 == uVar7) goto LAB_004fdde5;
          uVar7 = uVar7 + 1;
          uVar1 = *piVar8;
          piVar8 = piVar8 + 0x21;
        } while (uVar1 != local_24c);
        bVar19 = uVar7 < uVar14;
      }
      iVar6 = (int)uVar7;
      if (!bVar19) goto LAB_004fdde5;
    }
    if (iVar6 < 0) {
      return;
    }
    if ((pNVar4 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) ||
       (pcVar10 = (char *)(long)(this_03->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused, (long)pcVar10 < 1)) {
LAB_004fdee7:
      pcVar15 = (char *)0xffffffff;
    }
    else {
      if (pNVar4->idx == local_248) {
        bVar19 = true;
        pcVar15 = (char *)0x0;
      }
      else {
        pcVar15 = (char *)0x0;
        piVar8 = &pNVar4[1].idx;
        do {
          if (pcVar10 + -1 == pcVar15) goto LAB_004fdee7;
          pcVar15 = pcVar15 + 1;
          uVar1 = *piVar8;
          piVar8 = piVar8 + 0x21;
        } while (uVar1 != local_248);
        bVar19 = pcVar15 < pcVar10;
      }
      if (!bVar19) goto LAB_004fdee7;
    }
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this_03,pcVar15);
    pNVar4 = (this_02->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if ((pNVar4 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) &&
       (pcVar10 = (char *)(long)(this_02->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused, 0 < (long)pcVar10)) {
      if (pNVar4->idx == local_24c) {
        bVar19 = true;
        pcVar15 = (char *)0x0;
      }
      else {
        pcVar15 = (char *)0x0;
        piVar8 = &pNVar4[1].idx;
        do {
          if (pcVar10 + -1 == pcVar15) goto LAB_004fdfbe;
          pcVar15 = pcVar15 + 1;
          uVar1 = *piVar8;
          piVar8 = piVar8 + 0x21;
        } while (uVar1 != local_24c);
        bVar19 = pcVar15 < pcVar10;
      }
      if (bVar19) goto LAB_004fdfc3;
    }
LAB_004fdfbe:
    pcVar15 = (char *)0xffffffff;
LAB_004fdfc3:
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this_02,pcVar15);
    return;
  }
  local_1b0._0_4_ = cpp_dec_float_finite;
  local_1b0._4_4_ = 0x1c;
  local_228 = ZEXT816(0);
  local_218 = ZEXT816(0);
  local_208 = ZEXT816(0);
  local_1f8 = ZEXT816(0);
  local_1e8 = ZEXT816(0);
  local_1d8 = ZEXT816(0);
  local_1c8[0] = 0;
  local_1c8[1] = 0;
  stack0xfffffffffffffe40 = 0;
  uStack_1bb = 0;
  iStack_1b8 = 0;
  bStack_1b4 = false;
  if ((char)local_244 != '\0') {
    pSVar3 = this->lp_scaler;
    pnVar12 = val;
    puVar11 = local_b0;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar11 = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar20 * -2 + 1) * 4);
      puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
    }
    local_40 = (val->m_backend).exp;
    local_3c = (val->m_backend).neg;
    local_38._0_4_ = (val->m_backend).fpclass;
    local_38._4_4_ = (val->m_backend).prec_elem;
    val = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1a0;
    (*pSVar3->_vptr_SPxScaler[0x2a])(val,pSVar3,this,(ulong)local_24c,(ulong)local_248,local_b0);
  }
  lVar9 = 0x1c;
  pcVar13 = &val->m_backend;
  puVar11 = (uint *)local_228;
  for (; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar11 = (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar20 * -2 + 1) * 4);
    puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
  }
  iStack_1b8 = (val->m_backend).exp;
  bStack_1b4 = (val->m_backend).neg;
  fVar2 = (val->m_backend).fpclass;
  iVar5 = (val->m_backend).prec_elem;
  local_1b0._0_4_ = fVar2;
  local_1b0._4_4_ = iVar5;
  pNVar4 = (this_03->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  if ((pNVar4 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) ||
     (uVar14 = (ulong)(this_03->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, (long)uVar14 < 1)) {
LAB_004fdc5b:
    iVar6 = -1;
  }
  else {
    if (pNVar4->idx == local_248) {
      bVar19 = true;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      piVar8 = &pNVar4[1].idx;
      do {
        if (uVar14 - 1 == uVar7) goto LAB_004fdc5b;
        uVar7 = uVar7 + 1;
        uVar1 = *piVar8;
        piVar8 = piVar8 + 0x21;
      } while (uVar1 != local_248);
      bVar19 = uVar7 < uVar14;
    }
    iVar6 = (int)uVar7;
    if (!bVar19) goto LAB_004fdc5b;
  }
  if (iVar6 < 0) goto LAB_004fdd6f;
  pNVar18 = (this_02->data).
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .m_elem;
  if ((pNVar18 ==
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0) ||
     (uVar14 = (ulong)(this_02->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, (long)uVar14 < 1)) {
LAB_004fdd3b:
    iVar6 = -1;
  }
  else {
    if (pNVar18->idx == local_24c) {
      bVar19 = true;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      piVar8 = &pNVar18[1].idx;
      do {
        if (uVar14 - 1 == uVar7) goto LAB_004fdd3b;
        uVar7 = uVar7 + 1;
        uVar1 = *piVar8;
        piVar8 = piVar8 + 0x21;
      } while (uVar1 != local_24c);
      bVar19 = uVar7 < uVar14;
    }
    iVar6 = (int)uVar7;
    if (!bVar19) goto LAB_004fdd3b;
  }
  if (iVar6 < 0) {
LAB_004fdd6f:
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add2(&this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ,local_24c,1,(int *)&local_248,
           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)local_228);
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add2(&this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ,local_248,1,(int *)&local_24c,
           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)local_228);
    return;
  }
  if ((pNVar4 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) ||
     (uVar14 = (ulong)(this_03->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, (long)uVar14 < 1)) {
LAB_004fde4b:
    iVar6 = -1;
  }
  else {
    if (pNVar4->idx == local_248) {
      bVar19 = true;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      piVar8 = &pNVar4[1].idx;
      do {
        if (uVar14 - 1 == uVar7) goto LAB_004fde4b;
        uVar7 = uVar7 + 1;
        uVar1 = *piVar8;
        piVar8 = piVar8 + 0x21;
      } while (uVar1 != local_248);
      bVar19 = uVar7 < uVar14;
    }
    iVar6 = (int)uVar7;
    if (!bVar19) goto LAB_004fde4b;
  }
  puVar16 = (undefined4 *)local_228;
  pNVar18 = pNVar4 + iVar6;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pNVar18->val).m_backend.data._M_elems[0] = *puVar16;
    puVar16 = puVar16 + (ulong)bVar20 * -2 + 1;
    pNVar18 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((long)pNVar18 + ((ulong)bVar20 * -2 + 1) * 4);
  }
  pNVar4[iVar6].val.m_backend.exp = iStack_1b8;
  pNVar4[iVar6].val.m_backend.neg = bStack_1b4;
  pNVar4[iVar6].val.m_backend.fpclass = fVar2;
  pNVar4[iVar6].val.m_backend.prec_elem = iVar5;
  pNVar4 = (this_02->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  if ((pNVar4 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) &&
     (uVar14 = (ulong)(this_02->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, 0 < (long)uVar14)) {
    if (pNVar4->idx == local_24c) {
      bVar19 = true;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      piVar8 = &pNVar4[1].idx;
      do {
        if (uVar14 - 1 == uVar7) goto LAB_004fdf50;
        uVar7 = uVar7 + 1;
        uVar1 = *piVar8;
        piVar8 = piVar8 + 0x21;
      } while (uVar1 != local_24c);
      bVar19 = uVar7 < uVar14;
    }
    iVar6 = (int)uVar7;
    if (bVar19) goto LAB_004fdf57;
  }
LAB_004fdf50:
  iVar6 = -1;
LAB_004fdf57:
  puVar16 = (undefined4 *)local_228;
  pNVar18 = pNVar4 + iVar6;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pNVar18->val).m_backend.data._M_elems[0] = *puVar16;
    puVar16 = puVar16 + (ulong)bVar20 * -2 + 1;
    pNVar18 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((long)pNVar18 + ((ulong)bVar20 * -2 + 1) * 4);
  }
  pNVar4[iVar6].val.m_backend.exp = iStack_1b8;
  pNVar4[iVar6].val.m_backend.neg = bStack_1b4;
  pNVar4[iVar6].val.m_backend.fpclass = fVar2;
  pNVar4[iVar6].val.m_backend.prec_elem = iVar5;
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }